

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O0

char * Diligent::GetRenderDeviceTypeString(RENDER_DEVICE_TYPE DeviceType,bool bGetEnumString)

{
  Char *Message;
  undefined1 local_38 [8];
  string msg;
  bool bGetEnumString_local;
  char *pcStack_10;
  RENDER_DEVICE_TYPE DeviceType_local;
  
  switch(DeviceType) {
  case RENDER_DEVICE_TYPE_UNDEFINED:
    pcStack_10 = "Undefined";
    if (bGetEnumString) {
      pcStack_10 = "RENDER_DEVICE_TYPE_UNDEFINED";
    }
    break;
  case RENDER_DEVICE_TYPE_D3D11:
    pcStack_10 = "Direct3D11";
    if (bGetEnumString) {
      pcStack_10 = "RENDER_DEVICE_TYPE_D3D11";
    }
    break;
  case RENDER_DEVICE_TYPE_D3D12:
    pcStack_10 = "Direct3D12";
    if (bGetEnumString) {
      pcStack_10 = "RENDER_DEVICE_TYPE_D3D12";
    }
    break;
  case RENDER_DEVICE_TYPE_GL:
    pcStack_10 = "OpenGL";
    if (bGetEnumString) {
      pcStack_10 = "RENDER_DEVICE_TYPE_GL";
    }
    break;
  case RENDER_DEVICE_TYPE_GLES:
    pcStack_10 = "OpenGLES";
    if (bGetEnumString) {
      pcStack_10 = "RENDER_DEVICE_TYPE_GLES";
    }
    break;
  case RENDER_DEVICE_TYPE_VULKAN:
    pcStack_10 = "Vulkan";
    if (bGetEnumString) {
      pcStack_10 = "RENDER_DEVICE_TYPE_VULKAN";
    }
    break;
  case RENDER_DEVICE_TYPE_METAL:
    pcStack_10 = "Metal";
    if (bGetEnumString) {
      pcStack_10 = "RENDER_DEVICE_TYPE_METAL";
    }
    break;
  case RENDER_DEVICE_TYPE_WEBGPU:
    pcStack_10 = "WebGPU";
    if (bGetEnumString) {
      pcStack_10 = "RENDER_DEVICE_TYPE_WEBGPU";
    }
    break;
  default:
    msg.field_2._M_local_buf[0xb] = bGetEnumString;
    msg.field_2._12_4_ = DeviceType;
    FormatString<char[32]>((string *)local_38,(char (*) [32])"Unknown/unsupported device type");
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"GetRenderDeviceTypeString",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0x636);
    std::__cxx11::string::~string((string *)local_38);
    pcStack_10 = "UNKNOWN";
  }
  return pcStack_10;
}

Assistant:

const char* GetRenderDeviceTypeString(RENDER_DEVICE_TYPE DeviceType, bool bGetEnumString)
{
    static_assert(RENDER_DEVICE_TYPE_COUNT == 8, "Did you add a new device type? Please update the switch below.");
    switch (DeviceType)
    {
        // clang-format off
        case RENDER_DEVICE_TYPE_UNDEFINED: return bGetEnumString ? "RENDER_DEVICE_TYPE_UNDEFINED" : "Undefined";  break;
        case RENDER_DEVICE_TYPE_D3D11:     return bGetEnumString ? "RENDER_DEVICE_TYPE_D3D11"     : "Direct3D11"; break;
        case RENDER_DEVICE_TYPE_D3D12:     return bGetEnumString ? "RENDER_DEVICE_TYPE_D3D12"     : "Direct3D12"; break;
        case RENDER_DEVICE_TYPE_GL:        return bGetEnumString ? "RENDER_DEVICE_TYPE_GL"        : "OpenGL";     break;
        case RENDER_DEVICE_TYPE_GLES:      return bGetEnumString ? "RENDER_DEVICE_TYPE_GLES"      : "OpenGLES";   break;
        case RENDER_DEVICE_TYPE_VULKAN:    return bGetEnumString ? "RENDER_DEVICE_TYPE_VULKAN"    : "Vulkan";     break;
        case RENDER_DEVICE_TYPE_METAL:     return bGetEnumString ? "RENDER_DEVICE_TYPE_METAL"     : "Metal";      break;
        case RENDER_DEVICE_TYPE_WEBGPU:    return bGetEnumString ? "RENDER_DEVICE_TYPE_WEBGPU"    : "WebGPU";     break;
        // clang-format on
        default: UNEXPECTED("Unknown/unsupported device type"); return "UNKNOWN";
    }
}